

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tensor.hpp
# Opt level: O0

void __thiscall scp::Tensor<double>::Tensor(Tensor<double> *this,uint64_t order,uint64_t *sizes)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  uint64_t *puVar5;
  double *pdVar6;
  unsigned_long *puVar7;
  int local_28 [2];
  uint64_t *local_20;
  uint64_t *sizes_local;
  uint64_t order_local;
  Tensor<double> *this_local;
  
  this->_vptr_Tensor = (_func_int **)&PTR__Tensor_00125c70;
  (this->_shape).order = order;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = order;
  uVar4 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  local_20 = sizes;
  sizes_local = (uint64_t *)order;
  order_local = (uint64_t)this;
  puVar5 = (uint64_t *)operator_new__(uVar4);
  (this->_shape).sizes = puVar5;
  iVar3 = std::accumulate<unsigned_long_const*,int,std::multiplies<unsigned_long>>
                    (local_20,local_20 + (long)sizes_local,1);
  this->_length = (long)iVar3;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = this->_length;
  uVar4 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pdVar6 = (double *)operator_new__(uVar4);
  this->_values = pdVar6;
  this->_owner = true;
  if (sizes_local != (uint64_t *)0x0) {
    local_28[0] = 0;
    puVar7 = std::find<unsigned_long_const*,int>(local_20,local_20 + (long)sizes_local,local_28);
    if (puVar7 == local_20 + (long)sizes_local) {
      std::copy_n<unsigned_long_const*,unsigned_long,unsigned_long*>
                (local_20,(this->_shape).order,(this->_shape).sizes);
      return;
    }
    __assert_fail("std::find(sizes, sizes + order, 0) == sizes + order",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Reiex[P]SciPP/include/SciPP/Core/templates/Tensor.hpp"
                  ,0x9c,"scp::Tensor<double>::Tensor(uint64_t, const uint64_t *) [TValue = double]")
    ;
  }
  __assert_fail("order != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Reiex[P]SciPP/include/SciPP/Core/templates/Tensor.hpp"
                ,0x9b,"scp::Tensor<double>::Tensor(uint64_t, const uint64_t *) [TValue = double]");
}

Assistant:

constexpr Tensor<TValue>::Tensor(uint64_t order, const uint64_t* sizes) :
		_shape{ order, new uint64_t[order] },
		_length(std::accumulate(sizes, sizes + order, 1, std::multiplies<uint64_t>())),
		_values(new TValue[_length]),
		_owner(true)
	{
		assert(order != 0);
		assert(std::find(sizes, sizes + order, 0) == sizes + order);

		std::copy_n(sizes, _shape.order, _shape.sizes);
	}